

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall TextField::TextField(TextField *this)

{
  Vector2f local_30;
  
  UIComponent::UIComponent(&this->super_UIComponent);
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__TextField_001c5200;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__TextField_001c5238;
  sf::Text::Text(&this->label);
  sf::Text::Text(&this->field);
  local_30.x = 0.0;
  local_30.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->background,&local_30);
  local_30.x = 0.0;
  local_30.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->caret,&local_30);
  return;
}

Assistant:

TextField::TextField() {}